

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,allocator<int> *alloc)

{
  int *piVar1;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  allocator<int> *in_stack_ffffffffffffffc8;
  
  Catch::clara::std::allocator<int>::allocator((allocator<int> *)in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->m_capacity = 4;
  in_RDI->m_dynamic_capacity = 0;
  in_RDI->m_dynamic_data = (pointer)0x0;
  piVar1 = static_begin_ptr(in_RDI);
  in_RDI->m_end = piVar1;
  in_RDI->m_begin = piVar1;
  return;
}

Assistant:

small_vector(const Alloc& alloc)
        : m_alloc(alloc)
        , m_capacity(StaticCapacity)
        , m_dynamic_capacity(0)
        , m_dynamic_data(nullptr)
    {
        m_begin = m_end = static_begin_ptr();
    }